

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTest.cxx
# Opt level: O2

string * __thiscall
cmCTest::GetCostDataFile_abi_cxx11_(string *__return_storage_ptr__,cmCTest *this)

{
  string local_50;
  string local_30;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_50,"CostDataFile",(allocator<char> *)&local_30);
  GetCTestConfiguration(__return_storage_ptr__,this,&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  if (__return_storage_ptr__->_M_string_length == 0) {
    GetBinaryDir_abi_cxx11_(&local_30,this);
    std::operator+(&local_50,&local_30,"/Testing/Temporary/CTestCostData.txt");
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_50);
    std::__cxx11::string::~string((string *)&local_50);
    std::__cxx11::string::~string((string *)&local_30);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string cmCTest::GetCostDataFile()
{
  std::string fname = this->GetCTestConfiguration("CostDataFile");
  if (fname.empty()) {
    fname = this->GetBinaryDir() + "/Testing/Temporary/CTestCostData.txt";
  }
  return fname;
}